

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O1

wstring * clask::to_wstring(wstring *__return_storage_ptr__,string *input)

{
  char *__first;
  wstring_convert<std::codecvt_utf8_utf16<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  converter;
  wstring_convert<std::codecvt_utf8_utf16<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  wStack_88;
  
  std::__cxx11::
  wstring_convert<std::codecvt_utf8_utf16<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  ::wstring_convert(&wStack_88);
  __first = (input->_M_dataplus)._M_p;
  std::__cxx11::
  wstring_convert<std::codecvt_utf8_utf16<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  ::from_bytes(__return_storage_ptr__,&wStack_88,__first,__first + input->_M_string_length);
  std::__cxx11::
  wstring_convert<std::codecvt_utf8_utf16<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  ::~wstring_convert(&wStack_88);
  return __return_storage_ptr__;
}

Assistant:

inline std::wstring to_wstring(const std::string& input) {
  try {
    std::wstring_convert<std::codecvt_utf8_utf16<wchar_t>> converter;
    return converter.from_bytes(input);
  } catch (std::range_error&) {
    size_t length = input.length();
    std::wstring result;
    result.reserve(length);
    for (size_t i = 0; i < length; i++) {
      result.push_back(input[i] & 0xFF);
    }
    return result;
  }
}